

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::PackageImportDeclarationSyntax::getChild
          (PackageImportDeclarationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  undefined8 in_RDX;
  long in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff88;
  TokenOrSyntax *in_stack_ffffffffffffff90;
  nullptr_t in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  
  switch(in_RDX) {
  case 0:
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case 1:
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token);
    break;
  case 2:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)(in_RSI + 0x60),in_stack_ffffffffffffff88);
    break;
  case 3:
    token_00.info = in_stack_ffffffffffffffa0;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    TokenOrSyntax::TokenOrSyntax(in_stack_ffffffffffffff90,token_00);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax PackageImportDeclarationSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return keyword;
        case 2: return &items;
        case 3: return semi;
        default: return nullptr;
    }
}